

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFJob.cc
# Opt level: O0

void __thiscall
QPDFJob::processFile
          (QPDFJob *this,unique_ptr<QPDF,_std::default_delete<QPDF>_> *pdf,char *filename,
          char *password,bool used_for_input,bool main_input)

{
  char *pdf_00;
  int iVar1;
  function<void_(QPDF_*,_const_char_*)> local_88;
  undefined1 local_68 [8];
  type fn;
  undefined1 local_40 [8];
  _Mem_fn<void_(QPDF::*)(const_char_*,_const_char_*)> f1;
  bool main_input_local;
  bool used_for_input_local;
  char *password_local;
  char *filename_local;
  unique_ptr<QPDF,_std::default_delete<QPDF>_> *pdf_local;
  QPDFJob *this_local;
  
  fn._M_bound_args.super__Tuple_impl<0UL,_std::_Placeholder<1>,_const_char_*,_std::_Placeholder<2>_>
  .super__Tuple_impl<1UL,_const_char_*,_std::_Placeholder<2>_>.
  super__Head_base<1UL,_const_char_*,_false>._M_head_impl =
       (_Tuple_impl<0UL,_std::_Placeholder<1>,_const_char_*,_std::_Placeholder<2>_>)
       QPDF::processFile;
  f1.super__Mem_fn_base<void_(QPDF::*)(const_char_*,_const_char_*),_true>._14_1_ = main_input;
  f1.super__Mem_fn_base<void_(QPDF::*)(const_char_*,_const_char_*),_true>._15_1_ = used_for_input;
  password_local = filename;
  filename_local = (char *)pdf;
  pdf_local = (unique_ptr<QPDF,_std::default_delete<QPDF>_> *)this;
  local_40 = (undefined1  [8])
             std::mem_fn<void(char_const*,char_const*),QPDF>
                       ((_Mem_fn<void_(QPDF::*)(const_char_*,_const_char_*)> *)QPDF::processFile,0);
  std::
  bind<std::_Mem_fn<void(QPDF::*)(char_const*,char_const*)>&,std::_Placeholder<1>const&,char_const*&,std::_Placeholder<2>const&>
            ((type *)local_68,(_Mem_fn<void_(QPDF::*)(const_char_*,_const_char_*)> *)local_40,
             (_Placeholder<1> *)&std::placeholders::_1,&password_local,
             (_Placeholder<2> *)&std::placeholders::_2);
  pdf_00 = filename_local;
  std::function<void(QPDF*,char_const*)>::
  function<std::_Bind<std::_Mem_fn<void(QPDF::*)(char_const*,char_const*)>(std::_Placeholder<1>,char_const*,std::_Placeholder<2>)>&,void>
            ((function<void(QPDF*,char_const*)> *)&local_88,(type *)local_68);
  iVar1 = strcmp(password_local,"");
  doProcess(this,(unique_ptr<QPDF,_std::default_delete<QPDF>_> *)pdf_00,&local_88,password,
            iVar1 == 0,
            (bool)(f1.super__Mem_fn_base<void_(QPDF::*)(const_char_*,_const_char_*),_true>._15_1_ &
                  1),(bool)(f1.super__Mem_fn_base<void_(QPDF::*)(const_char_*,_const_char_*),_true>.
                            _14_1_ & 1));
  std::function<void_(QPDF_*,_const_char_*)>::~function(&local_88);
  return;
}

Assistant:

void
QPDFJob::processFile(
    std::unique_ptr<QPDF>& pdf,
    char const* filename,
    char const* password,
    bool used_for_input,
    bool main_input)
{
    auto f1 = std::mem_fn<void(char const*, char const*)>(&QPDF::processFile);
    auto fn = std::bind(f1, std::placeholders::_1, filename, std::placeholders::_2);
    doProcess(pdf, fn, password, strcmp(filename, "") == 0, used_for_input, main_input);
}